

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O0

void absl::lts_20250127::cord_internal::swap(InlineData *lhs,InlineData *rhs)

{
  InlineData *rhs_local;
  InlineData *lhs_local;
  
  InlineData::unpoison(lhs);
  InlineData::unpoison(rhs);
  InlineData::Rep::SwapValue(&lhs->rep_,(Rep)(rhs->rep_).field_0.as_tree,&rhs->rep_);
  InlineData::poison(rhs);
  InlineData::poison(lhs);
  return;
}

Assistant:

inline void swap(InlineData& lhs, InlineData& rhs) noexcept {
  lhs.unpoison();
  rhs.unpoison();
  // TODO(b/145829486): `std::swap(lhs.rep_, rhs.rep_)` results in bad codegen
  // on clang, spilling the temporary swap value on the stack. Since `Rep` is
  // trivial, we can make clang DTRT by calling a hand-rolled `SwapValue` where
  // we pass `rhs` both by value (register allocated) and by reference. The IR
  // then folds and inlines correctly into an optimized swap without spill.
  lhs.rep_.SwapValue(rhs.rep_, rhs.rep_);
  rhs.poison();
  lhs.poison();
}